

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::color3h>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *result)

{
  bool bVar1;
  allocator local_81;
  string local_80;
  color3h local_5a;
  char local_53;
  color3h value_1;
  char nc;
  char c;
  color3h local_2e;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *pvStack_28;
  color3h value;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  pvStack_28 = result;
  ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,&local_2e);
    if (bVar1) {
      ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::push_back
                (pvStack_28,&local_2e);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)&value_1);
        if (!bVar1) {
          return false;
        }
        if ((char)value_1.r.value == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,&local_53);
          if (!bVar1) {
            return false;
          }
          if (local_53 == end_symbol) break;
        }
        if ((char)value_1.r.value != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,&local_5a);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
        push_back(pvStack_28,&local_5a);
      }
      bVar1 = ::std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>::
              empty(pvStack_28);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_80,"Empty array.\n",&local_81);
        PushError(this,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&value_1.g,"Not starting with the value of requested type.\n",
                 (allocator *)((long)&value_1.r.value + 1));
      PushError(this,(string *)&value_1.g);
      ::std::__cxx11::string::~string((string *)&value_1.g);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&value_1.r.value + 1));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}